

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

QWidgetList * __thiscall
QAbstractScrollAreaScrollBarContainer::widgets
          (QWidgetList *__return_storage_ptr__,QAbstractScrollAreaScrollBarContainer *this,
          LogicalPosition position)

{
  int iVar1;
  long *plVar2;
  parameter_type pQVar3;
  int i;
  int iVar4;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar1 = scrollBarLayoutIndex(this);
  if (position == LogicalRight) {
    iVar4 = (**(code **)(*(long *)&this->layout->super_QLayout + 200))();
    iVar1 = iVar1 + 1;
    QList<QWidget_*>::reserve(__return_storage_ptr__,(long)(iVar4 - iVar1));
    for (; iVar1 < iVar4; iVar1 = iVar1 + 1) {
      plVar2 = (long *)(**(code **)(*(long *)&this->layout->super_QLayout + 0xa8))
                                 (this->layout,iVar1);
      pQVar3 = (parameter_type)(**(code **)(*plVar2 + 0x68))(plVar2);
      QList<QWidget_*>::append(__return_storage_ptr__,pQVar3);
    }
  }
  else if (position == LogicalLeft) {
    QList<QWidget_*>::reserve(__return_storage_ptr__,(long)iVar1);
    iVar4 = 0;
    if (iVar1 < 1) {
      iVar1 = iVar4;
    }
    for (; iVar1 != iVar4; iVar4 = iVar4 + 1) {
      plVar2 = (long *)(**(code **)(*(long *)&this->layout->super_QLayout + 0xa8))
                                 (this->layout,iVar4);
      pQVar3 = (parameter_type)(**(code **)(*plVar2 + 0x68))(plVar2);
      QList<QWidget_*>::append(__return_storage_ptr__,pQVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QWidgetList QAbstractScrollAreaScrollBarContainer::widgets(LogicalPosition position)
{
    QWidgetList list;
    const int scrollBarIndex = scrollBarLayoutIndex();
    if (position == LogicalLeft) {
        list.reserve(scrollBarIndex);
        for (int i = 0; i < scrollBarIndex; ++i)
            list.append(layout->itemAt(i)->widget());
    } else if (position == LogicalRight) {
        const int layoutItemCount = layout->count();
        list.reserve(layoutItemCount - (scrollBarIndex + 1));
        for (int i = scrollBarIndex + 1; i < layoutItemCount; ++i)
            list.append(layout->itemAt(i)->widget());
    }
    return list;
}